

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_INIT_HANDLE sasl_init_clone(SASL_INIT_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SASL_INIT_HANDLE local_18;
  SASL_INIT_INSTANCE *sasl_init_instance;
  SASL_INIT_HANDLE value_local;
  
  local_18 = (SASL_INIT_HANDLE)malloc(8);
  if (local_18 != (SASL_INIT_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SASL_INIT_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SASL_INIT_HANDLE sasl_init_clone(SASL_INIT_HANDLE value)
{
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)malloc(sizeof(SASL_INIT_INSTANCE));
    if (sasl_init_instance != NULL)
    {
        sasl_init_instance->composite_value = amqpvalue_clone(((SASL_INIT_INSTANCE*)value)->composite_value);
        if (sasl_init_instance->composite_value == NULL)
        {
            free(sasl_init_instance);
            sasl_init_instance = NULL;
        }
    }

    return sasl_init_instance;
}